

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient3dexact(double *pa,double *pb,double *pc,double *pd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double _0;
  double _j;
  double _i;
  double err3;
  double err2;
  double err1;
  double blo;
  double bhi;
  double alo;
  double ahi;
  double abig;
  double c;
  double around;
  double bround;
  double avirt;
  double bvirt;
  int i;
  int deterlen;
  double deter [96];
  int cdlen;
  int ablen;
  double cddet [48];
  double abdet [48];
  int dlen;
  int clen;
  int blen;
  int alen;
  double ddet [24];
  double cdet [24];
  double bdet [24];
  double adet [24];
  int dablen;
  int cdalen;
  int bcdlen;
  int abclen;
  double dab [12];
  double cda [12];
  double bcd [12];
  double abc [12];
  int templen;
  double temp8 [8];
  double bd [4];
  double ac [4];
  double da [4];
  double cd [4];
  double bc [4];
  double ab [4];
  double dxby0;
  double cxay0;
  double axdy0;
  double dxcy0;
  double cxby0;
  double bxay0;
  double bxdy0;
  double axcy0;
  double dxay0;
  double cxdy0;
  double bxcy0;
  double axby0;
  double dxby1;
  double cxay1;
  double axdy1;
  double dxcy1;
  double cxby1;
  double bxay1;
  double bxdy1;
  double axcy1;
  double dxay1;
  double cxdy1;
  double bxcy1;
  double axby1;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar5 = splitter * *pa - (splitter * *pa - *pa);
  dVar6 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar5 = (*pa - dVar5) * (pb[1] - dVar6) +
          -(-dVar5 * (pb[1] - dVar6) + -(*pa - dVar5) * dVar6 + -dVar5 * dVar6 + *pa * pb[1]);
  dVar6 = splitter * *pb - (splitter * *pb - *pb);
  dVar7 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar6 = (*pb - dVar6) * (pa[1] - dVar7) +
          -(-dVar6 * (pa[1] - dVar7) + -(*pb - dVar6) * dVar7 + -dVar6 * dVar7 + *pb * pa[1]);
  dVar7 = dVar5 - dVar6;
  dVar8 = dVar5 - dVar7;
  bc[3] = (dVar5 - (dVar7 + dVar8)) + (dVar8 - dVar6);
  dVar5 = *pb * pc[1];
  dVar6 = splitter * *pb - (splitter * *pb - *pb);
  dVar7 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar6 = (*pb - dVar6) * (pc[1] - dVar7) +
          -(-dVar6 * (pc[1] - dVar7) + -(*pb - dVar6) * dVar7 + -dVar6 * dVar7 + dVar5);
  dVar7 = *pc * pb[1];
  dVar8 = splitter * *pc - (splitter * *pc - *pc);
  dVar9 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar8 = (*pc - dVar8) * (pb[1] - dVar9) +
          -(-dVar8 * (pb[1] - dVar9) + -(*pc - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = dVar6 - dVar8;
  cd[3] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  dVar6 = dVar5 + dVar9;
  dVar5 = (dVar5 - (dVar6 - (dVar6 - dVar5))) + (dVar9 - (dVar6 - dVar5));
  dVar8 = dVar5 - dVar7;
  bc[0] = (dVar5 - (dVar8 + (dVar5 - dVar8))) + ((dVar5 - dVar8) - dVar7);
  bc[2] = dVar6 + dVar8;
  bc[1] = (dVar6 - (bc[2] - (bc[2] - dVar6))) + (dVar8 - (bc[2] - dVar6));
  dVar5 = *pc * pd[1];
  dVar6 = splitter * *pc - (splitter * *pc - *pc);
  dVar7 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar6 = (*pc - dVar6) * (pd[1] - dVar7) +
          -(-dVar6 * (pd[1] - dVar7) + -(*pc - dVar6) * dVar7 + -dVar6 * dVar7 + dVar5);
  dVar7 = *pd * pc[1];
  dVar8 = splitter * *pd - (splitter * *pd - *pd);
  dVar9 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar8 = (*pd - dVar8) * (pc[1] - dVar9) +
          -(-dVar8 * (pc[1] - dVar9) + -(*pd - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = dVar6 - dVar8;
  da[3] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  dVar6 = dVar5 + dVar9;
  dVar5 = (dVar5 - (dVar6 - (dVar6 - dVar5))) + (dVar9 - (dVar6 - dVar5));
  dVar8 = dVar5 - dVar7;
  cd[0] = (dVar5 - (dVar8 + (dVar5 - dVar8))) + ((dVar5 - dVar8) - dVar7);
  cd[2] = dVar6 + dVar8;
  cd[1] = (dVar6 - (cd[2] - (cd[2] - dVar6))) + (dVar8 - (cd[2] - dVar6));
  dVar5 = *pd * pa[1];
  dVar6 = splitter * *pd - (splitter * *pd - *pd);
  dVar7 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar6 = (*pd - dVar6) * (pa[1] - dVar7) +
          -(-dVar6 * (pa[1] - dVar7) + -(*pd - dVar6) * dVar7 + -dVar6 * dVar7 + dVar5);
  dVar7 = *pa * pd[1];
  dVar8 = splitter * *pa - (splitter * *pa - *pa);
  dVar9 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar8 = (*pa - dVar8) * (pd[1] - dVar9) +
          -(-dVar8 * (pd[1] - dVar9) + -(*pa - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = dVar6 - dVar8;
  ac[3] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  dVar6 = dVar5 + dVar9;
  dVar5 = (dVar5 - (dVar6 - (dVar6 - dVar5))) + (dVar9 - (dVar6 - dVar5));
  dVar8 = dVar5 - dVar7;
  da[0] = (dVar5 - (dVar8 + (dVar5 - dVar8))) + ((dVar5 - dVar8) - dVar7);
  da[2] = dVar6 + dVar8;
  da[1] = (dVar6 - (da[2] - (da[2] - dVar6))) + (dVar8 - (da[2] - dVar6));
  dVar5 = *pa * pc[1];
  dVar6 = splitter * *pa - (splitter * *pa - *pa);
  dVar7 = splitter * pc[1] - (splitter * pc[1] - pc[1]);
  dVar6 = (*pa - dVar6) * (pc[1] - dVar7) +
          -(-dVar6 * (pc[1] - dVar7) + -(*pa - dVar6) * dVar7 + -dVar6 * dVar7 + dVar5);
  dVar7 = *pc * pa[1];
  dVar8 = splitter * *pc - (splitter * *pc - *pc);
  dVar9 = splitter * pa[1] - (splitter * pa[1] - pa[1]);
  dVar8 = (*pc - dVar8) * (pa[1] - dVar9) +
          -(-dVar8 * (pa[1] - dVar9) + -(*pc - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = dVar6 - dVar8;
  bd[3] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  dVar6 = dVar5 + dVar9;
  dVar5 = (dVar5 - (dVar6 - (dVar6 - dVar5))) + (dVar9 - (dVar6 - dVar5));
  dVar8 = dVar5 - dVar7;
  ac[0] = (dVar5 - (dVar8 + (dVar5 - dVar8))) + ((dVar5 - dVar8) - dVar7);
  ac[2] = dVar6 + dVar8;
  ac[1] = (dVar6 - (ac[2] - (ac[2] - dVar6))) + (dVar8 - (ac[2] - dVar6));
  dVar5 = *pb * pd[1];
  dVar6 = splitter * *pb - (splitter * *pb - *pb);
  dVar7 = splitter * pd[1] - (splitter * pd[1] - pd[1]);
  dVar6 = (*pb - dVar6) * (pd[1] - dVar7) +
          -(-dVar6 * (pd[1] - dVar7) + -(*pb - dVar6) * dVar7 + -dVar6 * dVar7 + dVar5);
  dVar7 = *pd * pb[1];
  dVar8 = splitter * *pd - (splitter * *pd - *pd);
  dVar9 = splitter * pb[1] - (splitter * pb[1] - pb[1]);
  dVar8 = (*pd - dVar8) * (pb[1] - dVar9) +
          -(-dVar8 * (pb[1] - dVar9) + -(*pd - dVar8) * dVar9 + -dVar8 * dVar9 + dVar7);
  dVar9 = dVar6 - dVar8;
  temp8[7] = (dVar6 - (dVar9 + (dVar6 - dVar9))) + ((dVar6 - dVar9) - dVar8);
  dVar6 = dVar5 + dVar9;
  dVar5 = (dVar5 - (dVar6 - (dVar6 - dVar5))) + (dVar9 - (dVar6 - dVar5));
  dVar8 = dVar5 - dVar7;
  bd[0] = (dVar5 - (dVar8 + (dVar5 - dVar8))) + ((dVar5 - dVar8) - dVar7);
  bd[2] = dVar6 + dVar8;
  bd[1] = (dVar6 - (bd[2] - (bd[2] - dVar6))) + (dVar8 - (bd[2] - dVar6));
  iVar1 = fast_expansion_sum_zeroelim(4,da + 3,4,ac + 3,(double *)&stack0xfffffffffffffe18);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,(double *)&stack0xfffffffffffffe18,4,bd + 3,dab + 0xb);
  iVar2 = fast_expansion_sum_zeroelim(4,ac + 3,4,bc + 3,(double *)&stack0xfffffffffffffe18);
  iVar2 = fast_expansion_sum_zeroelim
                    (iVar2,(double *)&stack0xfffffffffffffe18,4,temp8 + 7,(double *)&bcdlen);
  for (bvirt._0_4_ = 0; bvirt._0_4_ < 4; bvirt._0_4_ = bvirt._0_4_ + 1) {
    temp8[(long)bvirt._0_4_ + 7] = -temp8[(long)bvirt._0_4_ + 7];
    bd[(long)bvirt._0_4_ + 3] = -bd[(long)bvirt._0_4_ + 3];
  }
  iVar3 = fast_expansion_sum_zeroelim(4,bc + 3,4,cd + 3,(double *)&stack0xfffffffffffffe18);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,(double *)&stack0xfffffffffffffe18,4,bd + 3,bcd + 0xb);
  iVar4 = fast_expansion_sum_zeroelim(4,cd + 3,4,da + 3,(double *)&stack0xfffffffffffffe18);
  iVar4 = fast_expansion_sum_zeroelim
                    (iVar4,(double *)&stack0xfffffffffffffe18,4,temp8 + 7,cda + 0xb);
  iVar4 = scale_expansion_zeroelim(iVar4,cda + 0xb,pa[2],bdet + 0x17);
  iVar1 = scale_expansion_zeroelim(iVar1,dab + 0xb,-pb[2],cdet + 0x17);
  iVar2 = scale_expansion_zeroelim(iVar2,(double *)&bcdlen,pc[2],ddet + 0x17);
  iVar3 = scale_expansion_zeroelim(iVar3,bcd + 0xb,-pd[2],(double *)&blen);
  iVar1 = fast_expansion_sum_zeroelim(iVar4,bdet + 0x17,iVar1,cdet + 0x17,cddet + 0x2f);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,ddet + 0x17,iVar3,(double *)&blen,(double *)&cdlen);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,cddet + 0x2f,iVar2,(double *)&cdlen,(double *)&i);
  return *(double *)(&i + (long)(iVar1 + -1) * 2);
}

Assistant:

REAL orient3dexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL adet[24], bdet[24], cdet[24], ddet[24];
  int alen, blen, clen, dlen;
  REAL abdet[48], cddet[48];
  int ablen, cdlen;
  REAL deter[96];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  alen = scale_expansion_zeroelim(bcdlen, bcd, pa[2], adet);
  blen = scale_expansion_zeroelim(cdalen, cda, -pb[2], bdet);
  clen = scale_expansion_zeroelim(dablen, dab, pc[2], cdet);
  dlen = scale_expansion_zeroelim(abclen, abc, -pd[2], ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}